

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.cc
# Opt level: O1

int __thiscall webrtc::AudioProcessingImpl::StopDebugRecording(AudioProcessingImpl *this)

{
  CritScope cs_render;
  CritScope cs_capture;
  CritScope CStack_18;
  CritScope local_10;
  
  rtc::CritScope::CritScope(&CStack_18,&this->crit_render_);
  rtc::CritScope::CritScope(&local_10,&this->crit_capture_);
  rtc::CritScope::~CritScope(&local_10);
  rtc::CritScope::~CritScope(&CStack_18);
  return -4;
}

Assistant:

int AudioProcessingImpl::StopDebugRecording() {
  // Run in a single-threaded manner.
  rtc::CritScope cs_render(&crit_render_);
  rtc::CritScope cs_capture(&crit_capture_);

#ifdef WEBRTC_AUDIOPROC_DEBUG_DUMP
  // We just return if recording hasn't started.
  if (debug_dump_.debug_file->Open()) {
    if (debug_dump_.debug_file->CloseFile() == -1) {
      return kFileError;
    }
  }
  return kNoError;
#else
  return kUnsupportedFunctionError;
#endif  // WEBRTC_AUDIOPROC_DEBUG_DUMP
}